

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O3

void __thiscall
despot::BaseTag::MostLikelyRobPosition
          (BaseTag *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles)

{
  pointer ppSVar1;
  pointer piVar2;
  State *pSVar3;
  pointer __s;
  int iVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  allocator_type local_19;
  
  if ((MostLikelyRobPosition(std::vector<despot::State*,std::allocator<despot::State*>>const&)::
       probs == '\0') &&
     (iVar4 = __cxa_guard_acquire(&MostLikelyRobPosition(std::vector<despot::State*,std::allocator<despot::State*>>const&)
                                   ::probs), iVar4 != 0)) {
    iVar4 = despot::Floor::NumCells();
    std::vector<double,_std::allocator<double>_>::vector
              (&MostLikelyRobPosition::probs,(long)iVar4,&local_19);
    __cxa_atexit(std::vector<double,_std::allocator<double>_>::~vector,&MostLikelyRobPosition::probs
                 ,&__dso_handle);
    __cxa_guard_release(&MostLikelyRobPosition(std::vector<despot::State*,std::allocator<despot::State*>>const&)
                         ::probs);
  }
  __s = MostLikelyRobPosition::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  ppSVar1 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 3;
    piVar2 = (this->rob_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar7 = 0.0;
    lVar6 = 0;
    do {
      pSVar3 = ppSVar1[lVar6];
      iVar4 = piVar2[*(int *)(pSVar3 + 0xc)];
      dVar8 = *(double *)(pSVar3 + 0x18) + __s[iVar4];
      __s[iVar4] = dVar8;
      if (dVar8 <= dVar7) {
        dVar8 = dVar7;
      }
      dVar7 = dVar8;
      lVar6 = lVar6 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
  }
  if ((long)MostLikelyRobPosition::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_finish - (long)__s != 0) {
    lVar5 = (long)MostLikelyRobPosition::probs.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)__s >> 3;
    memset(__s,0,(lVar5 + (ulong)(lVar5 == 0)) * 8);
  }
  despot::Floor::GetCell((int)this + 0x58);
  return;
}

Assistant:

Coord BaseTag::MostLikelyRobPosition(const vector<State*>& particles) const {
	static vector<double> probs = vector<double>(floor_.NumCells());

	double maxWeight = 0;
	int rob = -1;
	for (int i = 0; i < particles.size(); i++) {
		TagState* tagstate = static_cast<TagState*>(particles[i]);
		int id = rob_[tagstate->state_id];
		probs[id] += tagstate->weight;

		if (probs[id] > maxWeight) {
			maxWeight = probs[id];
			rob = id;
		}
	}

	for (int i = 0; i < probs.size(); i++) {
		probs[i] = 0.0;
	}

	return floor_.GetCell(rob);
}